

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start)

{
  int iVar1;
  int i1;
  int iVar2;
  type_conflict5 tVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 in_register_0000000c;
  int iVar7;
  ulong uVar8;
  int local_8c;
  ulong local_88;
  long local_80;
  long local_78;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_88 = CONCAT44(in_register_0000000c,start);
  local_80 = (long)end;
  uVar4 = 2;
  local_70 = compare;
  do {
    if ((int)uVar4 < 0) {
      return;
    }
    iVar1 = SPxShellsort<int,_soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::incs[uVar4];
    iVar6 = iVar1 + (int)local_88;
    uVar5 = local_88;
    for (local_78 = (long)iVar6; local_78 <= local_80; local_78 = local_78 + 1) {
      i1 = keys[local_78];
      uVar8 = uVar5 & 0xffffffff;
      while (iVar2 = (int)uVar8, iVar7 = iVar1 + iVar2, iVar6 <= iVar7) {
        Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator()(&local_68,local_70,i1,keys[iVar2]);
        local_8c = 0;
        tVar3 = boost::multiprecision::operator<(&local_68,&local_8c);
        if (!tVar3) break;
        keys[iVar7] = keys[iVar2];
        uVar8 = (ulong)(uint)(iVar2 - iVar1);
      }
      keys[iVar7] = i1;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}